

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O0

Vec_Vec_t * Saig_ManCexMinCollectFrameTerms(Aig_Man_t *pAig,Abc_Cex_t *pCex)

{
  int iVar1;
  Vec_Int_t *p;
  Vec_Vec_t *p_00;
  Aig_Obj_t *pObj_00;
  Vec_Int_t *vFrameCisOne;
  Vec_Int_t *local_48;
  int local_40;
  int local_3c;
  int f;
  int i;
  Aig_Obj_t *pObj;
  Vec_Int_t *vLeaves;
  Vec_Int_t *vRoots;
  Vec_Vec_t *vFrameCis;
  Abc_Cex_t *pCex_local;
  Aig_Man_t *pAig_local;
  
  p = Vec_IntAlloc(1000);
  p_00 = Vec_VecStart(pCex->iFrame + 1);
  for (local_40 = pCex->iFrame; -1 < local_40; local_40 = local_40 + -1) {
    if (local_40 == pCex->iFrame) {
      local_48 = (Vec_Int_t *)0x0;
    }
    else {
      local_48 = Vec_VecEntryInt(p_00,local_40 + 1);
    }
    Saig_ManCexMinGetCos(pAig,pCex,local_48,p);
    Aig_ManIncrementTravId(pAig);
    for (local_3c = 0; iVar1 = Vec_IntSize(p), local_3c < iVar1; local_3c = local_3c + 1) {
      iVar1 = Vec_IntEntry(p,local_3c);
      pObj_00 = Aig_ManObj(pAig,iVar1);
      vFrameCisOne = Vec_VecEntryInt(p_00,local_40);
      Saig_ManCexMinCollectFrameTerms_rec(pAig,pObj_00,vFrameCisOne);
    }
  }
  Vec_IntFree(p);
  return p_00;
}

Assistant:

Vec_Vec_t * Saig_ManCexMinCollectFrameTerms( Aig_Man_t * pAig, Abc_Cex_t * pCex )
{
    Vec_Vec_t * vFrameCis;
    Vec_Int_t * vRoots, * vLeaves;
    Aig_Obj_t * pObj;
    int i, f;
    // create terminals
    vRoots = Vec_IntAlloc( 1000 );
    vFrameCis = Vec_VecStart( pCex->iFrame+1 );
    for ( f = pCex->iFrame; f >= 0; f-- )
    {
        // create roots
        vLeaves = (f == pCex->iFrame) ? NULL : Vec_VecEntryInt(vFrameCis, f+1);
        Saig_ManCexMinGetCos( pAig, pCex, vLeaves, vRoots );
        // collect nodes starting from the roots
        Aig_ManIncrementTravId( pAig );
        Aig_ManForEachObjVec( vRoots, pAig, pObj, i )
            Saig_ManCexMinCollectFrameTerms_rec( pAig, pObj, Vec_VecEntryInt(vFrameCis, f) );
    }
    Vec_IntFree( vRoots );
    return vFrameCis;
}